

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O2

void __thiscall
boost::detail::interruption_checker::interruption_checker
          (interruption_checker *this,pthread_mutex_t *cond_mutex,pthread_cond_t *cond)

{
  bool bVar1;
  int iVar2;
  thread_data_base *ptVar3;
  lock_guard<boost::mutex> guard;
  lock_guard<boost::mutex> local_20;
  
  ptVar3 = get_current_thread_data();
  this->thread_info = ptVar3;
  this->m = cond_mutex;
  if (ptVar3 == (thread_data_base *)0x0) {
    this->set = false;
    this->done = false;
  }
  else {
    bVar1 = ptVar3->interrupt_enabled;
    this->set = bVar1;
    this->done = false;
    if (bVar1 == true) {
      local_20.m = &ptVar3->data_mutex;
      mutex::lock(local_20.m);
      check_for_interruption(this);
      ptVar3 = this->thread_info;
      ptVar3->cond_mutex = cond_mutex;
      ptVar3->current_cond = cond;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->m);
      if (iVar2 == 0) {
        lock_guard<boost::mutex>::~lock_guard(&local_20);
        return;
      }
      __assert_fail("!pthread_mutex_lock(m)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/thread_data.hpp"
                    ,0xd1,
                    "boost::detail::interruption_checker::interruption_checker(pthread_mutex_t *, pthread_cond_t *)"
                   );
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)cond_mutex);
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("!pthread_mutex_lock(m)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/thread_data.hpp"
                ,0xd5,
                "boost::detail::interruption_checker::interruption_checker(pthread_mutex_t *, pthread_cond_t *)"
               );
}

Assistant:

explicit interruption_checker(pthread_mutex_t* cond_mutex,pthread_cond_t* cond):
                thread_info(detail::get_current_thread_data()),m(cond_mutex),
                set(thread_info && thread_info->interrupt_enabled), done(false)
            {
                if(set)
                {
                    lock_guard<mutex> guard(thread_info->data_mutex);
                    check_for_interruption();
                    thread_info->cond_mutex=cond_mutex;
                    thread_info->current_cond=cond;
                    BOOST_VERIFY(!pthread_mutex_lock(m));
                }
                else
                {
                    BOOST_VERIFY(!pthread_mutex_lock(m));
                }
            }